

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

value_type * __thiscall
gnuplotio::
IteratorRange<__gnu_cxx::__normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::tuple<double,_double,_double>_>
::deref(value_type *__return_storage_ptr__,
       IteratorRange<__gnu_cxx::__normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::tuple<double,_double,_double>_>
       *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference ptVar2;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>,_std::tuple<double,_double,_double>_>
  *this_local;
  
  bVar1 = is_end(this);
  if (!bVar1) {
    ptVar2 = __gnu_cxx::
             __normal_iterator<const_std::tuple<double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>
             ::operator*(&this->it);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
    super__Head_base<2UL,_double,_false>._M_head_impl =
         (ptVar2->super__Tuple_impl<0UL,_double,_double,_double>).
         super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
         super__Head_base<2UL,_double,_false>._M_head_impl;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl =
         (ptVar2->super__Tuple_impl<0UL,_double,_double,_double>).
         super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (ptVar2->super__Tuple_impl<0UL,_double,_double,_double>).
         super__Head_base<0UL,_double,_false>._M_head_impl;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attepted to dereference past end of iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_type deref() const {
        static_assert(sizeof(TV) && !is_container,
            "deref called on nested container");
        if(is_end()) {
            throw std::runtime_error("attepted to dereference past end of iterator");
        }
        return *it;
    }